

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_variableAttributeAndChildIssues_Test::~Parser_variableAttributeAndChildIssues_Test
          (Parser_variableAttributeAndChildIssues_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, variableAttributeAndChildIssues)
{
    const std::string in1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"randy\">\n"
        "    <variable lame=\"randy\" name=\"Na\" units=\"daves\"/>\n"
        "  </component>\n"
        "</model>\n";
    const std::string expectError1 = "Variable 'Na' has an invalid attribute 'lame'.";
    const std::string expectWarning1 = "Model does not contain the units 'daves' required by variable 'Na' in component 'randy'.";
    const std::string in2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"randy\">\n"
        "    <variable name=\"randy\" son=\"stan\" units=\"second\">\n"
        "      <daughter name=\"shelly\"/>\n"
        "    </variable>\n"
        "  </component>\n"
        "</model>\n";
    const std::string expectError2 = "Variable 'randy' has an invalid child element 'daughter'.";
    const std::string expectError3 = "Variable 'randy' has an invalid attribute 'son'.";

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in1);
    EXPECT_EQ(size_t(1), p->errorCount());
    EXPECT_EQ(size_t(1), p->warningCount());
    EXPECT_EQ(size_t(0), p->messageCount());
    EXPECT_EQ(expectError1, p->error(0)->description());
    EXPECT_EQ(expectWarning1, p->warning(0)->description());
    EXPECT_EQ(nullptr, p->message(0));

    p->parseModel(in2);
    EXPECT_EQ(size_t(2), p->errorCount());
    EXPECT_EQ(expectError2, p->error(0)->description());
    EXPECT_EQ(expectError3, p->error(1)->description());
}